

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test.cc
# Opt level: O0

TargetBits
highwayhash::anon_unknown_0::VerifyImplementations<unsigned_long[2]>
          (unsigned_long (*known_good) [65] [2])

{
  TargetBits TVar1;
  _func_void_char_ptr_unsigned_long *local_a0;
  unsigned_long (*local_98) [2];
  unsigned_long (*expected) [2];
  uint64_t size;
  char in [65];
  uint local_3c;
  unsigned_long uStack_38;
  TargetBits targets;
  HHKey key;
  unsigned_long (*known_good_local) [65] [2];
  
  uStack_38 = 0x706050403020100;
  key[0] = 0xf0e0d0c0b0a0908;
  key[1] = 0x1716151413121110;
  key[2] = 0x1f1e1d1c1b1a1918;
  local_3c = 0xffffffff;
  memset(&size,0,0x41);
  for (expected = (unsigned_long (*) [2])0x0; expected < (unsigned_long (*) [2])0x41;
      expected = (unsigned_long (*) [2])((long)*expected + 1)) {
    *(char *)((long)&size + (long)expected) = (char)expected;
    local_98 = *known_good + (long)expected;
    local_a0 = OnFailure;
    TVar1 = InstructionSets::
            RunAll<highwayhash::HighwayHashTest,_const_unsigned_long_(&)[4],_char_(&)[65],_unsigned_long_&,_const_unsigned_long_(*&)[2],_void_(*)(const_char_*,_unsigned_long)>
                      ((unsigned_long (*) [4])&stack0xffffffffffffffc8,(char (*) [65])&size,
                       (unsigned_long *)&expected,&local_98,&local_a0);
    local_3c = TVar1 & local_3c;
  }
  return local_3c;
}

Assistant:

TargetBits VerifyImplementations(const Result (&known_good)[kMaxSize + 1]) {
  const HHKey key = {0x0706050403020100ULL, 0x0F0E0D0C0B0A0908ULL,
                     0x1716151413121110ULL, 0x1F1E1D1C1B1A1918ULL};

  TargetBits targets = ~0U;

  // For each test input: empty string, 00, 00 01, ...
  char in[kMaxSize + 1] = {0};
  // Fast enough that we don't need a thread pool.
  for (uint64_t size = 0; size <= kMaxSize; ++size) {
    in[size] = static_cast<char>(size);
#if PRINT_RESULTS
    Result actual;
    targets &= InstructionSets::Run<HighwayHash>(key, in, size, &actual);
    Print(actual);
#else
    const Result* expected = &known_good[size];
    targets &= InstructionSets::RunAll<HighwayHashTest>(key, in, size, expected,
                                                        &OnFailure);
#endif
  }
  return targets;
}